

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

tnt_schema * tnt_schema_new(tnt_schema *s)

{
  mh_assoc_t *pmVar1;
  bool bVar2;
  
  bVar2 = s == (tnt_schema *)0x0;
  if ((bVar2) && (s = (tnt_schema *)tnt_mem_alloc(0x10), s == (tnt_schema *)0x0)) {
    return (tnt_schema *)0x0;
  }
  pmVar1 = mh_assoc_new();
  s->space_hash = pmVar1;
  s->alloc = (uint)bVar2;
  return s;
}

Assistant:

struct tnt_schema *tnt_schema_new(struct tnt_schema *s) {
	int alloc = (s == NULL);
	if (!s) {
		s = tnt_mem_alloc(sizeof(struct tnt_schema));
		if (!s) return NULL;
	}
	s->space_hash = mh_assoc_new();
	s->alloc = alloc;
	return s;
}